

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryReader::read<pbrt::Texture>(BinaryReader *this,shared_ptr<pbrt::Texture> *t)

{
  int32_t ID;
  int local_2c;
  
  read<int,void>(this,&local_2c);
  getEntity<pbrt::Texture>((BinaryReader *)&stack0xffffffffffffffd8,(int)this);
  std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&t->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

inline void read(std::shared_ptr<T> &t)
    {
      int32_t ID;
      read(ID);
      t = getEntity<T>(ID);
    }